

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

int base64_stream_decode_avx(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  size_t sVar11;
  bool bVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  byte bVar15;
  uint uVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i lo;
  
  iVar9 = state->eof;
  if (iVar9 != 0) {
    *outlen = 0;
    if (iVar9 == 1 && srclen != 0) {
      state->eof = 2;
      state->bytes = 0;
      bVar12 = srclen == 1 && base64_table_dec_8bit[(byte)*src] == 0xfe;
    }
    else {
      bVar12 = false;
    }
    goto LAB_0010743c;
  }
  bVar15 = state->carry;
  sVar18 = (size_t)(uint)state->bytes;
  iVar9 = 0;
  sVar17 = 0;
  sVar11 = srclen;
  uVar8 = state->bytes;
  switch(sVar18) {
  case 0:
    do {
      auVar7 = _DAT_0010d070;
      auVar6 = _DAT_0010d030;
      auVar3 = _DAT_0010d010;
      if (0x17 < srclen) {
        uVar19 = srclen - 8 >> 4;
        auVar22._8_4_ = 0xf2f2f2f;
        auVar22._0_8_ = 0xf2f2f2f0f2f2f2f;
        auVar22._12_4_ = 0xf2f2f2f;
        auVar23._8_4_ = 0x2f2f2f2f;
        auVar23._0_8_ = 0x2f2f2f2f2f2f2f2f;
        auVar23._12_4_ = 0x2f2f2f2f;
        auVar24._8_4_ = 0x2f2f2f2f;
        auVar24._0_8_ = 0x2f2f2f2f2f2f2f2f;
        auVar24._12_4_ = 0x2f2f2f2f;
        auVar25._8_4_ = 0x1400140;
        auVar25._0_8_ = 0x140014001400140;
        auVar25._12_4_ = 0x1400140;
        auVar26._8_4_ = 0x11000;
        auVar26._0_8_ = 0x1100000011000;
        auVar26._12_4_ = 0x11000;
        uVar13 = uVar19;
        do {
          auVar21 = SUB6416(ZEXT864(0xb9b9bfbf04131000),0);
          if (uVar13 < 8) {
            if (uVar13 < 4) {
              auVar27 = *(undefined1 (*) [16])src;
              auVar28 = vpsrld_avx(auVar27,4);
              auVar28 = vpand_avx(auVar28,auVar22);
              auVar4 = vpshufb_avx(auVar3,auVar28);
              auVar2 = vpand_avx(auVar27,auVar23);
              auVar2 = vpshufb_avx(auVar6,auVar2);
              auVar2 = vpand_avx(auVar2,auVar4);
              auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
              if (uVar13 < 2) {
                if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                ) || (auVar2 >> 0x1f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                              (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar2[0xf] < '\0') goto LAB_001072ee;
                auVar3 = vpcmpeqb_avx(auVar27,_DAT_0010d020);
                auVar3 = vpaddb_avx(auVar28,auVar3);
                auVar3 = vpshufb_avx(auVar21,auVar3);
                auVar3 = vpaddb_avx(auVar27,auVar3);
                auVar3 = vpmaddubsw_avx(auVar3,_DAT_0010d050);
                auVar3 = vpmaddwd_avx(auVar3,_DAT_0010d060);
                auVar3 = vpshufb_avx(auVar3,_DAT_0010d070);
                *(undefined1 (*) [16])out = auVar3;
              }
              else {
                if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                ) || (auVar2 >> 0x1f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                              (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar2[0xf] < '\0') goto LAB_001072ee;
                auVar2 = vpcmpeqb_avx(auVar27,auVar24);
                auVar28 = vpaddb_avx(auVar28,auVar2);
                auVar28 = vpshufb_avx(auVar21,auVar28);
                auVar27 = vpaddb_avx(auVar28,auVar27);
                auVar27 = vpmaddubsw_avx(auVar27,auVar25);
                auVar27 = vpmaddwd_avx(auVar27,auVar26);
                auVar27 = vpshufb_avx(auVar27,auVar7);
                *(undefined1 (*) [16])out = auVar27;
                pauVar10 = (undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc);
                auVar27 = *(undefined1 (*) [16])((long)src + 0x10);
                pauVar14 = (undefined1 (*) [16])((long)src + 0x10);
                auVar28 = vpsrld_avx(auVar27,4);
                auVar28 = vpand_avx(auVar28,auVar22);
                auVar4 = vpshufb_avx(auVar3,auVar28);
                auVar2 = vpand_avx(auVar27,auVar24);
                auVar2 = vpshufb_avx(auVar6,auVar2);
                auVar2 = vpand_avx(auVar2,auVar4);
                auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
                lVar20 = -2;
                if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                 (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                ) && (auVar2 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                              (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar2 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar2 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar2 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar2 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar2 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar2 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar2[0xf]) goto LAB_00107251;
              }
            }
            else {
              auVar27 = *(undefined1 (*) [16])src;
              auVar28 = vpsrld_avx(auVar27,4);
              auVar28 = vpand_avx(auVar28,auVar22);
              auVar4 = vpshufb_avx(auVar3,auVar28);
              auVar2 = vpand_avx(auVar27,auVar23);
              auVar2 = vpshufb_avx(auVar6,auVar2);
              auVar2 = vpand_avx(auVar2,auVar4);
              auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
              if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar2[0xf] < '\0') goto LAB_001072ee;
              auVar2 = vpcmpeqb_avx(auVar27,auVar24);
              auVar28 = vpaddb_avx(auVar28,auVar2);
              auVar28 = vpshufb_avx(auVar21,auVar28);
              auVar27 = vpaddb_avx(auVar28,auVar27);
              auVar27 = vpmaddubsw_avx(auVar27,auVar25);
              auVar27 = vpmaddwd_avx(auVar27,auVar26);
              auVar27 = vpshufb_avx(auVar27,auVar7);
              *(undefined1 (*) [16])out = auVar27;
              auVar27 = *(undefined1 (*) [16])((long)src + 0x10);
              auVar28 = vpsrld_avx(auVar27,4);
              auVar28 = vpand_avx(auVar28,auVar22);
              auVar4 = vpshufb_avx(auVar3,auVar28);
              auVar2 = vpand_avx(auVar27,auVar24);
              auVar2 = vpshufb_avx(auVar6,auVar2);
              auVar2 = vpand_avx(auVar2,auVar4);
              auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
              if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar2 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar2 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar2 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar2 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar2 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar2 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar2[0xf]) {
                auVar2 = vpcmpeqb_avx(auVar27,auVar24);
                auVar28 = vpaddb_avx(auVar28,auVar2);
                auVar28 = vpshufb_avx(auVar21,auVar28);
                auVar27 = vpaddb_avx(auVar28,auVar27);
                auVar27 = vpmaddubsw_avx(auVar27,auVar25);
                auVar27 = vpmaddwd_avx(auVar27,auVar26);
                auVar27 = vpshufb_avx(auVar27,auVar7);
                *(undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc) = auVar27;
                auVar27 = *(undefined1 (*) [16])((long)src + 0x20);
                auVar28 = vpsrld_avx(auVar27,4);
                auVar28 = vpand_avx(auVar28,auVar22);
                auVar4 = vpshufb_avx(auVar3,auVar28);
                auVar2 = vpand_avx(auVar27,auVar24);
                auVar2 = vpshufb_avx(auVar6,auVar2);
                auVar2 = vpand_avx(auVar2,auVar4);
                auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
                if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                ) || (auVar2 >> 0x1f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                              (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar2[0xf] < '\0') goto LAB_00107299;
                auVar2 = vpcmpeqb_avx(auVar27,auVar24);
                auVar28 = vpaddb_avx(auVar28,auVar2);
                auVar28 = vpshufb_avx(auVar21,auVar28);
                auVar27 = vpaddb_avx(auVar28,auVar27);
                auVar27 = vpmaddubsw_avx(auVar27,auVar25);
                auVar27 = vpmaddwd_avx(auVar27,auVar26);
                auVar27 = vpshufb_avx(auVar27,auVar7);
                *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x10) + 8) = auVar27;
                pauVar10 = (undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x20) + 4);
                auVar27 = *(undefined1 (*) [16])((long)src + 0x30);
                pauVar14 = (undefined1 (*) [16])((long)src + 0x30);
                auVar28 = vpsrld_avx(auVar27,4);
                auVar28 = vpand_avx(auVar28,auVar22);
                auVar4 = vpshufb_avx(auVar3,auVar28);
                auVar2 = vpand_avx(auVar27,auVar24);
                auVar2 = vpshufb_avx(auVar6,auVar2);
                auVar2 = vpand_avx(auVar2,auVar4);
                auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
                lVar20 = -4;
                if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                ) || (auVar2 >> 0x1f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                              (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar2[0xf] < '\0') goto LAB_001072af;
                goto LAB_00107251;
              }
            }
LAB_00107294:
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar13 = uVar13 - 1;
            goto LAB_001072ee;
          }
          auVar27 = *(undefined1 (*) [16])src;
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar23);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') goto LAB_001072ee;
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])out = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x10);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') goto LAB_00107294;
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc) = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x20);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
LAB_00107299:
            out = *(undefined1 (*) [16])((long)out + 0x10) + 8;
            src = (char *)((long)src + 0x20);
            uVar13 = uVar13 - 2;
            goto LAB_001072ee;
          }
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x10) + 8) = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x30);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
LAB_001072af:
            src = (char *)((long)src + 0x30);
            out = *(undefined1 (*) [16])((long)out + 0x20) + 4;
            uVar13 = uVar13 - 3;
            goto LAB_001072ee;
          }
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x20) + 4) = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x40);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
            out = (char *)((long)out + 0x30);
            src = (char *)((long)src + 0x40);
            uVar13 = uVar13 - 4;
            goto LAB_001072ee;
          }
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])((long)out + 0x30) = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x50);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
            out = *(undefined1 (*) [16])((long)out + 0x30) + 0xc;
            src = (char *)((long)src + 0x50);
            uVar13 = uVar13 - 5;
            goto LAB_001072ee;
          }
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x30) + 0xc) = auVar27;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x60);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
            out = *(undefined1 (*) [16])((long)out + 0x40) + 8;
            src = (char *)((long)src + 0x60);
            uVar13 = uVar13 - 6;
            goto LAB_001072ee;
          }
          auVar2 = vpcmpeqb_avx(auVar27,auVar24);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar28 = vpshufb_avx(auVar21,auVar28);
          auVar27 = vpaddb_avx(auVar28,auVar27);
          auVar27 = vpmaddubsw_avx(auVar27,auVar25);
          auVar27 = vpmaddwd_avx(auVar27,auVar26);
          auVar27 = vpshufb_avx(auVar27,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x40) + 8) = auVar27;
          out = *(undefined1 (*) [16])((long)out + 0x50) + 4;
          auVar27 = *(undefined1 (*) [16])((long)src + 0x70);
          src = (char *)((long)src + 0x70);
          auVar28 = vpsrld_avx(auVar27,4);
          auVar28 = vpand_avx(auVar28,auVar22);
          auVar4 = vpshufb_avx(auVar3,auVar28);
          auVar2 = vpand_avx(auVar27,auVar24);
          auVar2 = vpshufb_avx(auVar6,auVar2);
          auVar2 = vpand_avx(auVar2,auVar4);
          auVar2 = vpcmpgtb_avx(auVar2,(undefined1  [16])0x0);
          lVar20 = -8;
          pauVar10 = (undefined1 (*) [16])out;
          pauVar14 = (undefined1 (*) [16])src;
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
            uVar13 = uVar13 - 7;
            goto LAB_001072ee;
          }
LAB_00107251:
          auVar2 = vpcmpeqb_avx(auVar27,auVar23);
          auVar28 = vpaddb_avx(auVar28,auVar2);
          auVar21 = vpshufb_avx(auVar21,auVar28);
          auVar21 = vpaddb_avx(auVar21,auVar27);
          auVar21 = vpmaddubsw_avx(auVar21,auVar25);
          auVar21 = vpmaddwd_avx(auVar21,auVar26);
          auVar21 = vpshufb_avx(auVar21,auVar7);
          *pauVar10 = auVar21;
          src = (char *)(pauVar14 + 1);
          out = *pauVar10 + 0xc;
          uVar13 = uVar13 + lVar20;
        } while (uVar13 != 0);
        uVar13 = 0;
LAB_001072ee:
        srclen = (srclen - (srclen - 8 & 0xfffffffffffffff0)) + uVar13 * 0x10;
        sVar18 = sVar18 + (uVar19 - uVar13) * 0xc;
      }
      bVar12 = srclen == 0;
      srclen = srclen - 1;
      if (bVar12) {
        uVar16 = 0;
        bVar12 = true;
        iVar9 = 0;
        break;
      }
      puVar5 = *(undefined1 (*) [16])src;
      if (0xfd < base64_table_dec_8bit[(byte)*puVar5]) {
        bVar12 = false;
        goto LAB_0010742c;
      }
      src = *(undefined1 (*) [16])src + 1;
      bVar15 = base64_table_dec_8bit[(byte)*puVar5] << 2;
      sVar17 = sVar18;
switchD_00106cf4_caseD_1:
      uVar16 = 1;
      sVar11 = srclen - 1;
      sVar18 = sVar17;
      if (srclen == 0) {
LAB_001073da:
        bVar12 = true;
        break;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) {
        iVar9 = 2;
        uVar8 = 1;
        goto switchD_00106cf4_default;
      }
      src = (char *)((byte *)src + 1);
      (*(undefined1 (*) [16])out)[0] = bVar1 >> 4 | bVar15;
      out = *(undefined1 (*) [16])out + 1;
      bVar15 = bVar1 << 4;
      sVar17 = sVar17 + 1;
switchD_00106cf4_caseD_2:
      bVar12 = true;
      srclen = sVar11 - 1;
      sVar18 = sVar17;
      if (sVar11 == 0) {
        uVar16 = 2;
        break;
      }
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      bVar1 = base64_table_dec_8bit[bVar1];
      if (0xfd < bVar1) {
        iVar9 = 0;
        uVar16 = 3;
        uVar8 = 3;
        if (bVar1 != 0xfe) goto switchD_00106cf4_default;
        if (srclen == 0) {
          iVar9 = 1;
          break;
        }
        bVar1 = base64_table_dec_8bit[(byte)*src];
        bVar12 = sVar11 == 2;
        goto LAB_00107419;
      }
      *out = bVar1 >> 2 | bVar15;
      out = (char *)((byte *)out + 1);
      bVar15 = bVar1 << 6;
      sVar17 = sVar17 + 1;
switchD_00106cf4_caseD_3:
      bVar12 = srclen == 0;
      srclen = srclen - 1;
      sVar18 = sVar17;
      if (bVar12) {
        uVar16 = 3;
        goto LAB_001073da;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) goto code_r0x001073cc;
      src = (char *)((byte *)src + 1);
      *out = bVar1 | bVar15;
      out = (char *)((byte *)out + 1);
      sVar18 = sVar17 + 1;
      bVar15 = 0;
    } while( true );
  case 1:
    goto switchD_00106cf4_caseD_1;
  case 2:
    goto switchD_00106cf4_caseD_2;
  case 3:
    goto switchD_00106cf4_caseD_3;
  default:
switchD_00106cf4_default:
    uVar16 = uVar8;
    bVar12 = false;
    sVar18 = sVar17;
  }
  goto LAB_0010742f;
code_r0x001073cc:
  bVar12 = srclen == 0;
LAB_00107419:
  bVar12 = (bool)(bVar12 & bVar1 == 0xfe);
LAB_0010742c:
  iVar9 = 2;
  uVar16 = 0;
LAB_0010742f:
  state->eof = iVar9;
  state->bytes = uVar16;
  state->carry = bVar15;
  *outlen = sVar18;
LAB_0010743c:
  return (int)bVar12;
}

Assistant:

BASE64_DEC_FUNCTION(avx)
{
#if HAVE_AVX
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}